

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

char * match(MatchState *ms,char *s,char *p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  ushort **ppuVar6;
  ulong uVar7;
  ptrdiff_t *ppVar8;
  char *pcVar9;
  lua_State *L;
  byte *pbVar10;
  bool bVar11;
  
LAB_001137c9:
  do {
    pbVar5 = (byte *)p;
LAB_001137d5:
    while (bVar1 = *pbVar5, bVar1 == 0x25) {
      bVar1 = pbVar5[1];
      if ((ulong)bVar1 != 0x66) {
        if (bVar1 == 0x62) {
          bVar1 = pbVar5[2];
          if ((bVar1 == 0) || (pbVar5[3] == 0)) {
            L = ms->L;
            pcVar9 = "unbalanced pattern";
            goto LAB_00113b73;
          }
          if (*s != bVar1) {
            return (char *)0x0;
          }
          pbVar10 = (byte *)s + 1;
          if (ms->src_end <= pbVar10) {
            return (char *)0x0;
          }
          iVar3 = 1;
          goto LAB_0011392d;
        }
        ppuVar6 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar6 + (ulong)bVar1 * 2 + 1) & 8) == 0) goto LAB_00113898;
        if ((0x30 < bVar1) && (uVar4 = bVar1 - 0x31, (int)uVar4 < ms->level)) {
          uVar7 = ms->capture[uVar4].len;
          if (uVar7 != 0xffffffffffffffff) {
            if ((ulong)((long)ms->src_end - (long)s) < uVar7) {
              return (char *)0x0;
            }
            iVar3 = bcmp(ms->capture[uVar4].init,s,uVar7);
            if (iVar3 != 0) {
              return (char *)0x0;
            }
            if ((byte *)s == (byte *)0x0) {
              return (char *)0x0;
            }
            p = (char *)(pbVar5 + 2);
            s = (char *)((byte *)s + uVar7);
            goto LAB_001137c9;
          }
        }
        L = ms->L;
        pcVar9 = "invalid capture index";
        goto LAB_00113b73;
      }
      if (pbVar5[2] != 0x5b) {
        L = ms->L;
        pcVar9 = "missing \'[\' after \'%%f\' in pattern";
        goto LAB_00113b73;
      }
      pbVar10 = pbVar5 + 2;
      pbVar5 = (byte *)classend(ms,(char *)pbVar10);
      if (s == ms->src_init) {
        uVar4 = 0;
      }
      else {
        uVar4 = (uint)((byte *)s)[-1];
      }
      iVar3 = matchbracketclass(uVar4,(char *)pbVar10,(char *)(pbVar5 + -1));
      if (iVar3 != 0) {
        return (char *)0x0;
      }
      iVar3 = matchbracketclass((uint)(byte)*s,(char *)pbVar10,(char *)(pbVar5 + -1));
      if (iVar3 == 0) {
        return (char *)0x0;
      }
    }
    if (bVar1 < 0x28) {
      if (bVar1 == 0) {
        return (char *)(byte *)s;
      }
      if ((bVar1 == 0x24) && (pbVar5[1] == 0)) {
        if (s != ms->src_end) {
          return (char *)0x0;
        }
        return (char *)(byte *)s;
      }
    }
    else {
      if (bVar1 == 0x29) {
        uVar7 = (ulong)(uint)ms->level;
        ppVar8 = &ms->capture[uVar7 - 1].len;
        goto LAB_00113a45;
      }
      if (bVar1 == 0x28) {
        if (pbVar5[1] == 0x29) {
          pbVar5 = pbVar5 + 2;
          iVar3 = -2;
        }
        else {
          pbVar5 = pbVar5 + 1;
          iVar3 = -1;
        }
        pcVar9 = start_capture(ms,s,(char *)pbVar5,iVar3);
        return pcVar9;
      }
    }
LAB_00113898:
    p = classend(ms,(char *)pbVar5);
    if (s < ms->src_end) {
      iVar3 = singlematch((uint)(byte)*s,(char *)pbVar5,p);
      bVar11 = iVar3 != 0;
    }
    else {
      bVar11 = false;
    }
    bVar1 = *p;
    if (bVar1 == 0x3f) {
      if ((bVar11) &&
         (pcVar9 = match(ms,(char *)((byte *)s + 1),(char *)((byte *)p + 1)), pcVar9 != (char *)0x0)
         ) {
        return pcVar9;
      }
      pbVar5 = (byte *)p + 1;
      goto LAB_001137d5;
    }
    if (bVar1 == 0x2a) {
LAB_00113ad3:
      pcVar9 = max_expand(ms,s,(char *)pbVar5,p);
      return pcVar9;
    }
    if (bVar1 == 0x2b) {
      if (bVar11) {
        s = (char *)((byte *)s + 1);
        goto LAB_00113ad3;
      }
      goto LAB_00113ab7;
    }
    if (bVar1 == 0x2d) {
      pcVar9 = match(ms,s,(char *)((byte *)p + 1));
      while( true ) {
        if (pcVar9 != (char *)0x0) {
          return pcVar9;
        }
        if ((ms->src_end <= s) || (iVar3 = singlematch((uint)(byte)*s,(char *)pbVar5,p), iVar3 == 0)
           ) break;
        s = (char *)((byte *)s + 1);
        pcVar9 = match(ms,s,(char *)((byte *)p + 1));
      }
      goto LAB_00113ab7;
    }
    s = (char *)((byte *)s + 1);
    if (!bVar11) {
      return (char *)0x0;
    }
  } while( true );
LAB_0011392d:
  if (*pbVar10 == pbVar5[3]) {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) goto LAB_00113982;
  }
  else {
    iVar3 = iVar3 + (uint)(*pbVar10 == bVar1);
  }
  pbVar10 = pbVar10 + 1;
  if (pbVar10 == (byte *)ms->src_end) {
    return (char *)0x0;
  }
  goto LAB_0011392d;
LAB_00113982:
  p = (char *)(pbVar5 + 4);
  s = (char *)(pbVar10 + 1);
  goto LAB_001137c9;
  while( true ) {
    uVar7 = uVar7 - 1;
    lVar2 = *ppVar8;
    ppVar8 = ppVar8 + -2;
    if (lVar2 == -1) break;
LAB_00113a45:
    if ((int)uVar7 < 1) {
      L = ms->L;
      pcVar9 = "invalid pattern capture";
LAB_00113b73:
      luaL_error(L,pcVar9);
    }
  }
  uVar7 = uVar7 & 0xffffffff;
  ms->capture[uVar7].len = (long)s - (long)ms->capture[uVar7].init;
  pcVar9 = match(ms,s,(char *)(pbVar5 + 1));
  if (pcVar9 == (char *)0x0) {
    ms->capture[uVar7].len = -1;
LAB_00113ab7:
    pcVar9 = (char *)0x0;
  }
  return pcVar9;
}

Assistant:

static const char*match(MatchState*ms,const char*s,const char*p){
init:
switch(*p){
case'(':{
if(*(p+1)==')')
return start_capture(ms,s,p+2,(-2));
else
return start_capture(ms,s,p+1,(-1));
}
case')':{
return end_capture(ms,s,p+1);
}
case'%':{
switch(*(p+1)){
case'b':{
s=matchbalance(ms,s,p+2);
if(s==NULL)return NULL;
p+=4;goto init;
}
case'f':{
const char*ep;char previous;
p+=2;
if(*p!='[')
luaL_error(ms->L,"missing "LUA_QL("[")" after "
LUA_QL("%%f")" in pattern");
ep=classend(ms,p);
previous=(s==ms->src_init)?'\0':*(s-1);
if(matchbracketclass(uchar(previous),p,ep-1)||
!matchbracketclass(uchar(*s),p,ep-1))return NULL;
p=ep;goto init;
}
default:{
if(isdigit(uchar(*(p+1)))){
s=match_capture(ms,s,uchar(*(p+1)));
if(s==NULL)return NULL;
p+=2;goto init;
}
goto dflt;
}
}
}
case'\0':{
return s;
}
case'$':{
if(*(p+1)=='\0')
return(s==ms->src_end)?s:NULL;
else goto dflt;
}
default:dflt:{
const char*ep=classend(ms,p);
int m=s<ms->src_end&&singlematch(uchar(*s),p,ep);
switch(*ep){
case'?':{
const char*res;
if(m&&((res=match(ms,s+1,ep+1))!=NULL))
return res;
p=ep+1;goto init;
}
case'*':{
return max_expand(ms,s,p,ep);
}
case'+':{
return(m?max_expand(ms,s+1,p,ep):NULL);
}
case'-':{
return min_expand(ms,s,p,ep);
}
default:{
if(!m)return NULL;
s++;p=ep;goto init;
}
}
}
}
}